

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O2

float __thiscall Neuron::prevMem(Neuron *this)

{
  return (((this->m_prevMem + 45.0) * (this->m_prevMem + 60.0) * 0.5 - this->m_prevAdd) +
          this->m_extI + this->m_synI) / 50.0;
}

Assistant:

float Neuron::prevMem() const
{
    // Some magic configurable params of Izhikevich neuron model.
    const float k = 0.5f;
    const float vt = -45.0f;
    // Capacitance of neuron, dimension pF.
    const float cm = 50.0f;

    return (k * (m_prevMem - kDefaultMembrane) * (m_prevMem - vt) -
        m_prevAdd + m_extI + m_synI) / cm;
}